

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMAttrMapImpl.cpp
# Opt level: O1

int __thiscall
xercesc_4_0::DOMAttrMapImpl::findNamePoint
          (DOMAttrMapImpl *this,XMLCh *namespaceURI,XMLCh *localName)

{
  XMLCh XVar1;
  XMLCh XVar2;
  ulong uVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  XMLCh *pXVar7;
  undefined4 extraout_var_01;
  XMLCh *pXVar8;
  ulong uVar9;
  DOMNode *pDVar10;
  bool bVar11;
  int local_3c;
  XMLCh *pXVar6;
  undefined4 extraout_var_00;
  
  if ((this->fNodes != (DOMNodeVector *)0x0) && (uVar3 = this->fNodes->nextFreeSlot, uVar3 != 0)) {
    uVar9 = 0;
    do {
      if (uVar9 < this->fNodes->nextFreeSlot) {
        pDVar10 = this->fNodes->data[uVar9];
      }
      else {
        pDVar10 = (DOMNode *)0x0;
      }
      iVar5 = (*pDVar10->_vptr_DOMNode[0x16])(pDVar10);
      pXVar6 = (XMLCh *)CONCAT44(extraout_var,iVar5);
      iVar5 = (*pDVar10->_vptr_DOMNode[0x18])(pDVar10);
      pXVar7 = (XMLCh *)CONCAT44(extraout_var_00,iVar5);
      if (pXVar6 == namespaceURI) {
LAB_0026303e:
        if (pXVar7 != localName) {
          pXVar6 = pXVar7;
          if ((localName == (XMLCh *)0x0) || (pXVar8 = localName, pXVar7 == (XMLCh *)0x0)) {
            if (localName == (XMLCh *)0x0) {
              if (pXVar7 == (XMLCh *)0x0) goto LAB_002630a1;
LAB_00263096:
              bVar11 = *pXVar6 == L'\0';
            }
            else {
              bVar11 = *localName == L'\0';
              if (bVar11 && pXVar7 != (XMLCh *)0x0) goto LAB_00263096;
            }
            if (bVar11) goto LAB_002630a1;
          }
          else {
            do {
              XVar1 = *pXVar8;
              if (XVar1 == L'\0') goto LAB_00263096;
              XVar2 = *pXVar6;
              pXVar6 = pXVar6 + 1;
              pXVar8 = pXVar8 + 1;
            } while (XVar1 == XVar2);
          }
          bVar4 = false;
          if (pXVar7 != (XMLCh *)0x0) goto LAB_002630b3;
          iVar5 = (*pDVar10->_vptr_DOMNode[2])(pDVar10);
          pXVar6 = (XMLCh *)CONCAT44(extraout_var_01,iVar5);
          if (pXVar6 == localName) goto LAB_002630a1;
          if ((localName != (XMLCh *)0x0) && (pXVar7 = localName, pXVar6 != (XMLCh *)0x0)) {
            do {
              XVar1 = *pXVar7;
              if (XVar1 == L'\0') goto LAB_0026312a;
              XVar2 = *pXVar6;
              pXVar6 = pXVar6 + 1;
              pXVar7 = pXVar7 + 1;
            } while (XVar1 == XVar2);
            goto LAB_002630b3;
          }
          if (localName == (XMLCh *)0x0) {
            if (pXVar6 == (XMLCh *)0x0) goto LAB_002630a1;
LAB_0026312a:
            bVar11 = *pXVar6 == L'\0';
          }
          else {
            bVar11 = *localName == L'\0';
            if (bVar11 && pXVar6 != (XMLCh *)0x0) goto LAB_0026312a;
          }
          if (!bVar11) goto LAB_002630b3;
        }
LAB_002630a1:
        bVar4 = true;
        local_3c = (int)uVar9;
      }
      else {
        pXVar8 = namespaceURI;
        if ((namespaceURI == (XMLCh *)0x0) || (pXVar6 == (XMLCh *)0x0)) {
          if (pXVar6 == (XMLCh *)0x0) {
            if (namespaceURI == (XMLCh *)0x0) goto LAB_0026303e;
LAB_0026302e:
            bVar11 = *pXVar8 == L'\0';
          }
          else {
            bVar11 = *pXVar6 == L'\0';
            if ((namespaceURI != (XMLCh *)0x0) && (*pXVar6 == L'\0')) goto LAB_0026302e;
          }
          bVar4 = false;
          if (bVar11) goto LAB_0026303e;
        }
        else {
          do {
            XVar1 = *pXVar6;
            if (XVar1 == L'\0') goto LAB_0026302e;
            pXVar6 = pXVar6 + 1;
            XVar2 = *pXVar8;
            pXVar8 = pXVar8 + 1;
          } while (XVar1 == XVar2);
          bVar4 = false;
        }
      }
LAB_002630b3:
      if (bVar4) {
        return local_3c;
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != uVar3);
  }
  return -1;
}

Assistant:

int DOMAttrMapImpl::findNamePoint(const XMLCh *namespaceURI,
	const XMLCh *localName) const
{
    if (fNodes == 0)
	return -1;
    // This is a linear search through the same fNodes Vector.
    // The Vector is sorted on the DOM Level 1 nodename.
    // The DOM Level 2 NS keys are namespaceURI and Localname,
    // so we must linear search thru it.
    // In addition, to get this to work with fNodes without any namespace
    // (namespaceURI and localNames are both 0) we then use the nodeName
    // as a secondary key.
    const XMLSize_t len = fNodes -> size();
    for (XMLSize_t i = 0; i < len; ++i) {
        DOMNode *node = fNodes -> elementAt(i);
        const XMLCh * nNamespaceURI = node->getNamespaceURI();
        const XMLCh * nLocalName = node->getLocalName();
        if (!XMLString::equals(nNamespaceURI, namespaceURI))    //URI not match
            continue;
        else {
            if (XMLString::equals(localName, nLocalName)
                ||
                (nLocalName == 0 && XMLString::equals(localName, node->getNodeName())))
                return (int)i;
        }
    }
    return -1;	//not found
}